

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

ssize_t archive_write_pax_data(archive_write *a,void *buff,size_t s)

{
  long *plVar1;
  void *pvVar2;
  undefined8 *puVar3;
  ulong uVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  ulong length;
  void *pvVar8;
  void *pvVar9;
  undefined8 *__ptr;
  bool bVar10;
  
  pvVar2 = a->format_data;
  if (*(size_t *)((long)pvVar2 + 0x48) != 0) {
    iVar5 = __archive_write_output
                      (a,*(void **)((long)pvVar2 + 0x40),*(size_t *)((long)pvVar2 + 0x48));
    if ((iVar5 != 0) ||
       (iVar5 = __archive_write_nulls(a,*(size_t *)((long)pvVar2 + 0x58)), iVar5 != 0)) {
      return (long)iVar5;
    }
    *(undefined8 *)((long)pvVar2 + 0x48) = 0;
  }
  if (s == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar6 = (void *)0x0;
    pvVar8 = buff;
    do {
      bVar10 = true;
      __ptr = *(undefined8 **)((long)pvVar2 + 0x60);
      while (pvVar9 = pvVar6, __ptr != (undefined8 *)0x0) {
        if (__ptr[3] != 0) {
          if (__ptr != (undefined8 *)0x0) {
            uVar4 = __ptr[3];
            length = s - (long)pvVar6;
            if (uVar4 <= s - (long)pvVar6) {
              length = uVar4;
            }
            pvVar9 = pvVar8;
            if (*(int *)(__ptr + 1) == 0) {
              iVar5 = __archive_write_output(a,(void *)((long)buff + (long)pvVar6),length);
              plVar1 = (long *)(*(long *)((long)pvVar2 + 0x60) + 0x18);
              *plVar1 = *plVar1 - length;
              pvVar6 = (void *)((long)pvVar6 + length);
              bVar10 = iVar5 != 0;
              if (bVar10) {
                pvVar9 = (void *)(long)iVar5;
              }
            }
            else {
              __ptr[3] = uVar4 - length;
              pvVar6 = (void *)((long)pvVar6 + length);
              bVar10 = false;
            }
          }
          break;
        }
        puVar3 = (undefined8 *)*__ptr;
        free(__ptr);
        *(undefined8 **)((long)pvVar2 + 0x60) = puVar3;
        __ptr = puVar3;
      }
      pvVar7 = pvVar9;
    } while ((!bVar10) && (pvVar7 = pvVar6, pvVar8 = pvVar9, pvVar6 < s));
  }
  return (ssize_t)pvVar7;
}

Assistant:

static ssize_t
archive_write_pax_data(struct archive_write *a, const void *buff, size_t s)
{
	struct pax *pax;
	size_t ws;
	size_t total;
	int ret;

	pax = (struct pax *)a->format_data;

	/*
	 * According to GNU PAX format 1.0, write a sparse map
	 * before the body.
	 */
	if (archive_strlen(&(pax->sparse_map))) {
		ret = __archive_write_output(a, pax->sparse_map.s,
		    archive_strlen(&(pax->sparse_map)));
		if (ret != ARCHIVE_OK)
			return (ret);
		ret = __archive_write_nulls(a, pax->sparse_map_padding);
		if (ret != ARCHIVE_OK)
			return (ret);
		archive_string_empty(&(pax->sparse_map));
	}

	total = 0;
	while (total < s) {
		const unsigned char *p;

		while (pax->sparse_list != NULL &&
		    pax->sparse_list->remaining == 0) {
			struct sparse_block *sb = pax->sparse_list->next;
			free(pax->sparse_list);
			pax->sparse_list = sb;
		}

		if (pax->sparse_list == NULL)
			return (total);

		p = ((const unsigned char *)buff) + total;
		ws = s - total;
		if (ws > pax->sparse_list->remaining)
			ws = (size_t)pax->sparse_list->remaining;

		if (pax->sparse_list->is_hole) {
			/* Current block is hole thus we do not write
			 * the body. */
			pax->sparse_list->remaining -= ws;
			total += ws;
			continue;
		}

		ret = __archive_write_output(a, p, ws);
		pax->sparse_list->remaining -= ws;
		total += ws;
		if (ret != ARCHIVE_OK)
			return (ret);
	}
	return (total);
}